

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

Mat * __thiscall Mat::transpose(Mat *this)

{
  undefined8 uVar1;
  value_type vVar2;
  const_reference pvVar3;
  reference pvVar4;
  int *in_RSI;
  Mat *in_RDI;
  int j;
  int i;
  Mat *ret;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar5;
  int local_18;
  
  Mat((Mat *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
      (int)((ulong)in_RSI >> 0x20),(int)in_RSI);
  for (local_18 = 0; local_18 < *in_RSI; local_18 = local_18 + 1) {
    for (iVar5 = 0; iVar5 < in_RSI[1]; iVar5 = iVar5 + 1) {
      pvVar3 = std::vector<__int128,_std::allocator<__int128>_>::operator[]
                         ((vector<__int128,_std::allocator<__int128>_> *)(in_RSI + 4),
                          (long)(iVar5 * *in_RSI + local_18));
      vVar2 = *pvVar3;
      uVar1 = *(undefined8 *)((long)pvVar3 + 8);
      pvVar4 = std::vector<__int128,_std::allocator<__int128>_>::operator[]
                         (&in_RDI->val,(long)(local_18 * in_RSI[1] + iVar5));
      *(undefined8 *)((long)pvVar4 + 8) = uVar1;
      *(long *)pvVar4 = (long)vVar2;
    }
  }
  return in_RDI;
}

Assistant:

Mat Mat::transpose() const {
    Mat ret(c, r);
    for (int i = 0; i < r; i++) {
        for (int j = 0; j < c; j++) {
            ret.val[i * c + j] = val[j * r + i];
        }
    }
    return ret;
}